

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool __thiscall ON_NurbsSurface::IsValid(ON_NurbsSurface *this,ON_TextLog *text_log)

{
  uint cv_count;
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  double *pdVar6;
  char *format;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (this->m_dim < 1) {
    if (text_log != (ON_TextLog *)0x0) {
      format = "ON_NurbsSurface.m_dim = %d (should be > 0).\n";
LAB_0054b7c7:
      ON_TextLog::Print(text_log,format);
      return false;
    }
  }
  else if (this->m_cv == (double *)0x0) {
    if (text_log != (ON_TextLog *)0x0) {
      format = "ON_NurbsSurface.m_cv is nullptr.\n";
      goto LAB_0054b7c7;
    }
  }
  else {
    lVar8 = 0;
    do {
      uVar5 = this->m_order[lVar8];
      if ((int)uVar5 < 2) {
        if (text_log == (ON_TextLog *)0x0) {
LAB_0054b733:
          bVar3 = false;
        }
        else {
          bVar3 = false;
          ON_TextLog::Print(text_log,"ON_NurbsSurface.m_order[i] = %d (should be >= 2).\n",lVar8,
                            (ulong)uVar5);
        }
      }
      else {
        cv_count = this->m_cv_count[lVar8];
        if ((int)cv_count < (int)uVar5) {
          if (text_log == (ON_TextLog *)0x0) goto LAB_0054b733;
          bVar3 = false;
          ON_TextLog::Print(text_log,
                            "ON_NurbsSurface.m_cv_count[%d] = %d (should be >= m_order[%d]=%d).\n",
                            lVar8,(ulong)cv_count,lVar8);
        }
        else if (this->m_knot[lVar8] == (double *)0x0) {
          if (text_log == (ON_TextLog *)0x0) goto LAB_0054b733;
          bVar3 = false;
          ON_TextLog::Print(text_log,"ON_NurbsSurface.m_knot[i] is nullptr.\n");
        }
        else {
          bVar3 = ON_IsValidKnotVector(uVar5,cv_count,this->m_knot[lVar8],text_log);
          if (bVar3) {
            bVar3 = (int)((this->m_dim + 1) - (uint)(this->m_is_rat == 0)) <=
                    this->m_cv_stride[lVar8];
            if (text_log != (ON_TextLog *)0x0 && !bVar3) {
              bVar3 = false;
              ON_TextLog::Print(text_log,
                                "ON_NurbsSurface.m_cv_stride[%d]=%d is too small (should be >= %d).\n"
                                ,lVar8);
            }
          }
          else {
            if (text_log == (ON_TextLog *)0x0) goto LAB_0054b733;
            bVar3 = false;
            ON_TextLog::Print(text_log,"ON_NurbsSurface.m_knot[%d] is not a valid knot vector.\n",
                              lVar8);
          }
        }
      }
    } while ((lVar8 == 0) && (lVar8 = 1, bVar3 != false));
    if (bVar3 != false) {
      iVar4 = (this->m_dim + 1) - (uint)(this->m_is_rat == 0);
      if (((this->m_cv_stride[0] < iVar4) || (this->m_cv_stride[1] < this->m_cv_count[0] * iVar4))
         && (this->m_cv_stride[1] < iVar4 || this->m_cv_stride[0] < this->m_cv_count[1] * iVar4)) {
        if (text_log == (ON_TextLog *)0x0) {
          bVar3 = false;
        }
        else {
          bVar3 = false;
          ON_TextLog::Print(text_log,"ON_NurbsSurface.m_cv_stride[] = {%d,%d} is not valid.\n");
        }
      }
    }
    if (bVar3 == false) {
      return false;
    }
    uVar5 = (this->m_dim + 1) - (uint)(this->m_is_rat == 0);
    if (0 < (long)this->m_cv_count[0]) {
      lVar8 = 0;
      do {
        if (0 < this->m_cv_count[1]) {
          uVar9 = 0;
          do {
            iVar4 = 0;
            lVar7 = uVar9 * (long)this->m_cv_stride[1] + lVar8 * this->m_cv_stride[0];
            pdVar6 = this->m_cv + lVar7;
            if (lVar7 < 0) {
              pdVar6 = (double *)0x0;
            }
            if (this->m_cv == (double *)0x0) {
              pdVar6 = (double *)0x0;
            }
            bVar1 = 0 < (int)uVar5;
            if ((0 < (int)uVar5) && (iVar4 = 1, ABS(*pdVar6) < 1e+307)) {
              uVar2 = 1;
              do {
                uVar10 = uVar2;
                if (uVar5 == uVar10) {
                  iVar4 = 0;
                  goto LAB_0054b8a9;
                }
                uVar2 = uVar10 + 1;
              } while (ABS(pdVar6[uVar10]) < 1e+307);
              iVar4 = 1;
LAB_0054b8a9:
              bVar1 = (long)uVar10 < (long)(int)uVar5;
            }
            if (bVar1) goto LAB_0054b8c3;
            uVar9 = uVar9 + 1;
          } while (uVar9 != (uint)this->m_cv_count[1]);
        }
        iVar4 = 8;
LAB_0054b8c3:
        if (iVar4 != 8) goto LAB_0054b8db;
        lVar8 = lVar8 + 1;
      } while (lVar8 != this->m_cv_count[0]);
    }
    iVar4 = 5;
LAB_0054b8db:
    if (iVar4 == 0) {
      return bVar3;
    }
    if (iVar4 == 5) {
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool ON_NurbsSurface::IsValid( ON_TextLog* text_log ) const
{
  bool rc = false;

  if ( m_dim <= 0 )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsSurface.m_dim = %d (should be > 0).\n",m_dim);
    }
  }
  else if ( m_cv == nullptr )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsSurface.m_cv is nullptr.\n",m_dim);
    }
  }
  else
  {
    rc = true;
    for ( int i = 0; i < 2 && rc; i++ )
    {
      rc = false;
      if (m_order[i] < 2 )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_order[i] = %d (should be >= 2).\n",i,m_order[i]);
        }
      }
      else if (m_cv_count[i] < m_order[i] )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_cv_count[%d] = %d (should be >= m_order[%d]=%d).\n",i,m_cv_count[i],i,m_order[i]);
        }
      }
      else if (m_knot[i] == nullptr)
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_knot[i] is nullptr.\n");
        }
      }
      else if ( !ON_IsValidKnotVector( m_order[i], m_cv_count[i], m_knot[i], text_log ) )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_knot[%d] is not a valid knot vector.\n",i);
        }
      }
      else if ( m_cv_stride[i] < CVSize() )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_cv_stride[%d]=%d is too small (should be >= %d).\n",i,m_cv_stride[i],CVSize());
        }
      }
      else
        rc = true;
    }
    if ( rc )
    {
      int a0 = CVSize();
      int a1 = m_cv_count[0]*a0;
      int b1 = CVSize();
      int b0 = m_cv_count[1]*b1;
      if ( m_cv_stride[0] < a0 || m_cv_stride[1] < a1 )
      {
        if ( m_cv_stride[0] < b0 || m_cv_stride[1] < b1 )
        {
          if ( text_log )
          {
            text_log->Print("ON_NurbsSurface.m_cv_stride[] = {%d,%d} is not valid.\n",m_cv_stride[0],m_cv_stride[1]);
          }
          rc = false;
        }
      }
    }

    if (rc)
    {
      const int cvdim = CVSize();
      for (int i = 0; m_cv_count[0] > i; ++i)
      {
        for (int j = 0; m_cv_count[1] > j; ++j)
        {
          const double* cv = CV(i, j);
          for (int k = 0; cvdim > k; ++k)
          {
            if (false == ON_CV_COORDINATE_IS_VALID(cv[k]))
              return false;
          }
        }
      }
    }
  }

  return rc;
}